

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

FuncInfo * PostVisitFunction(ParseNodeFnc *pnodeFnc,ByteCodeGenerator *byteCodeGenerator)

{
  Scope *this;
  code *pcVar1;
  anon_class_16_2_de35cfdd fn;
  anon_class_16_2_de35cfdd fn_00;
  anon_class_16_2_d47fbb80 fn_01;
  anon_class_16_2_d47fbb80 fn_02;
  ByteCodeGenerator *this_00;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 uVar5;
  uint uVar6;
  PropertyId PVar7;
  RegSlot RVar8;
  Symbol *this_01;
  FuncInfo *pFVar9;
  FunctionInfo *pFVar10;
  Symbol *pSVar11;
  undefined4 *puVar12;
  FunctionBody *pFVar13;
  ParseNodeBlock *this_02;
  Scope *pSVar14;
  bool local_151;
  bool local_fb;
  bool hasAnyParamInClosure;
  bool doStackArgsOpt;
  Scope *funcExprScope;
  ParseNodeBlock *currentBlock;
  Scope *globalEvalBlockScope;
  bool setHasNonLocalReference;
  FunctionBody *parentFunctionBody;
  FuncInfo *parentFunc;
  bool newScopeForEval;
  anon_class_16_2_de35cfdd setArgScopeSlot;
  uint i;
  Symbol *argSym;
  Scope *paramScope;
  Scope *bodyScope;
  anon_class_16_2_d47fbb80 fnProcess;
  FuncInfo *enclosingNonLambda;
  bool funcExprWithName;
  Symbol *sym;
  FuncInfo *top;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodeFnc *pnodeFnc_local;
  
  top = (FuncInfo *)byteCodeGenerator;
  byteCodeGenerator_local = (ByteCodeGenerator *)pnodeFnc;
  sym = (Symbol *)ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  this_01 = ParseNodeFnc::GetFuncSymbol((ParseNodeFnc *)byteCodeGenerator_local);
  bVar2 = FuncInfo::IsGlobalFunction((FuncInfo *)sym);
  local_fb = false;
  if ((!bVar2) && (local_fb = false, this_01 != (Symbol *)0x0)) {
    local_fb = Symbol::GetIsFuncExpr(this_01);
  }
  BVar4 = FuncInfo::IsLambda((FuncInfo *)sym);
  if (BVar4 == 0) {
    bVar2 = FuncAllowsDirectSuper((FuncInfo *)sym,(ByteCodeGenerator *)top);
    if (bVar2) {
      pFVar10 = Js::FunctionProxy::GetFunctionInfo((FunctionProxy *)sym[6].pid);
      Js::FunctionInfo::SetAllowDirectSuper(pFVar10);
    }
  }
  else {
    pFVar9 = ByteCodeGenerator::FindEnclosingNonLambda((ByteCodeGenerator *)top);
    bVar2 = FuncInfo::IsGlobalFunction(pFVar9);
    if (bVar2) {
      Js::FunctionProxy::SetEnclosedByGlobalFunc((FunctionProxy *)sym[6].pid);
    }
    bVar2 = FuncAllowsDirectSuper(pFVar9,(ByteCodeGenerator *)top);
    if (bVar2) {
      pFVar10 = Js::FunctionProxy::GetFunctionInfo((FunctionProxy *)sym[6].pid);
      Js::FunctionInfo::SetAllowDirectSuper(pFVar10);
    }
  }
  if (local_fb != false) {
    bVar2 = Js::ParseableFunctionInfo::IsFunctionParsed((ParseableFunctionInfo *)sym[6].pid);
    if (bVar2) {
      pFVar13 = FuncInfo::GetParsedFunctionBody((FuncInfo *)sym);
      bVar2 = Js::FunctionBody::HasFuncExprNameReference(pFVar13);
      if (bVar2) {
        FuncInfo::SetFuncExprNameReference((FuncInfo *)sym,true);
      }
    }
    bVar2 = Symbol::GetHasNonLocalReference(this_01);
    if (bVar2) {
      ByteCodeGenerator::ProcessCapturedSym((ByteCodeGenerator *)top,this_01);
      FuncInfo::SetFuncExprNameReference((FuncInfo *)sym,true);
      if ((byteCodeGenerator_local->m_writer).m_longJumpOffsets !=
          (List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)0x0) {
        pFVar13 = FuncInfo::GetParsedFunctionBody((FuncInfo *)sym);
        Js::FunctionBody::SetFuncExprNameReference(pFVar13,true);
      }
      pFVar9 = top;
      pSVar14 = Symbol::GetScope(this_01);
      ByteCodeGenerator::ProcessScopeWithCapturedSym((ByteCodeGenerator *)pFVar9,pSVar14);
    }
  }
  if (((*(char *)&byteCodeGenerator_local->scriptContext != 'W') &&
      (bVar2 = Scope::GetIsObject(*(Scope **)&sym[5].assignmentState), !bVar2)) &&
     (bVar2 = ByteCodeGenerator::NeedObjectAsFunctionScope
                        ((ByteCodeGenerator *)top,(FuncInfo *)sym,
                         (ParseNodeFnc *)byteCodeGenerator_local), bVar2)) {
    Scope::SetIsObject(*(Scope **)&sym[5].assignmentState);
    bVar2 = FuncInfo::IsBodyAndParamScopeMerged((FuncInfo *)sym);
    if (!bVar2) {
      Scope::SetIsObject(*(Scope **)&sym[5].symbolType);
    }
  }
  if (((*(char *)&byteCodeGenerator_local->scriptContext == 'W') &&
      (bVar2 = Js::ParseableFunctionInfo::GetIsStrictMode((ParseableFunctionInfo *)sym[6].pid),
      bVar2)) &&
     (uVar5 = ByteCodeGenerator::GetFlags((ByteCodeGenerator *)top), (uVar5 & 0x400) != 0)) {
    Scope::SetIsObject(*(Scope **)&sym[5].assignmentState);
  }
  if ((byteCodeGenerator_local->m_writer).m_longJumpOffsets !=
      (List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    bVar2 = FuncInfo::IsGlobalFunction((FuncInfo *)sym);
    pFVar9 = top;
    pSVar11 = sym;
    if (!bVar2) {
      pSVar14 = *(Scope **)&sym[5].assignmentState;
      this = *(Scope **)&sym[5].symbolType;
      if ((this != (Scope *)0x0) && (bVar2 = Scope::GetHasOwnLocalInClosure(this), bVar2)) {
        fn_02.top = (FuncInfo *)pSVar11;
        fn_02.byteCodeGenerator = (ByteCodeGenerator *)pFVar9;
        Scope::ForEachSymbol<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__0>(this,fn_02);
        FuncInfo::SetHasLocalInClosure((FuncInfo *)sym,true);
      }
      bVar2 = Scope::GetHasOwnLocalInClosure(pSVar14);
      if (bVar2) {
        fn_01.top = (FuncInfo *)pSVar11;
        fn_01.byteCodeGenerator = (ByteCodeGenerator *)pFVar9;
        Scope::ForEachSymbol<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__0>
                  (pSVar14,fn_01);
        FuncInfo::SetHasLocalInClosure((FuncInfo *)sym,true);
      }
      PostVisitBlock((ParseNodeBlock *)byteCodeGenerator_local->parentScopeInfo,
                     (ByteCodeGenerator *)top);
      PostVisitBlock((ParseNodeBlock *)byteCodeGenerator_local->globalScope,(ByteCodeGenerator *)top
                    );
    }
    if ((((*(int *)&(byteCodeGenerator_local->m_writer).m_loopHeaders != 0) ||
         (bVar2 = FuncInfo::GetCallsEval((FuncInfo *)sym), bVar2)) ||
        (bVar2 = FuncInfo::GetHasClosureReference((FuncInfo *)sym), bVar2)) ||
       ((bVar2 = ByteCodeGenerator::InDynamicScope((ByteCodeGenerator *)top), bVar2 ||
        (uVar5 = ByteCodeGenerator::GetFlags((ByteCodeGenerator *)top), (uVar5 & 0x404) != 0)))) {
      ByteCodeGenerator::SetNeedEnvRegister((ByteCodeGenerator *)top);
    }
    bVar2 = FuncInfo::IsGlobalFunction((FuncInfo *)sym);
    if (bVar2) {
      bVar2 = FuncInfo::IsGlobalFunction((FuncInfo *)sym);
      if ((!bVar2) &&
         (bVar2 = ParseNodeFnc::IsModule((ParseNodeFnc *)byteCodeGenerator_local), !bVar2)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0xb78,"(top->IsGlobalFunction() || pnodeFnc->IsModule())",
                           "top->IsGlobalFunction() || pnodeFnc->IsModule()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      bVar3 = Js::ParseableFunctionInfo::GetIsStrictMode((ParseableFunctionInfo *)sym[6].pid);
      bVar2 = false;
      if (bVar3) {
        uVar5 = ByteCodeGenerator::GetFlags((ByteCodeGenerator *)top);
        bVar2 = (uVar5 & 0x400) != 0;
      }
      if (bVar2) {
        ByteCodeGenerator::SetNeedEnvRegister((ByteCodeGenerator *)top);
        ByteCodeGenerator::AssignFrameObjRegister((ByteCodeGenerator *)top);
        ByteCodeGenerator::AssignFrameDisplayRegister((ByteCodeGenerator *)top);
      }
    }
    else {
      bVar2 = FuncInfo::GetCallsEval((FuncInfo *)sym);
      if (((((bVar2) || (bVar2 = FuncInfo::GetChildCallsEval((FuncInfo *)sym), bVar2)) ||
           ((bVar2 = FuncInfo::GetHasArguments((FuncInfo *)sym), bVar2 &&
            (bVar2 = ByteCodeGenerator::NeedScopeObjectForArguments
                               ((ByteCodeGenerator *)top,(FuncInfo *)sym,
                                (ParseNodeFnc *)byteCodeGenerator_local), bVar2)))) ||
          (bVar2 = FuncInfo::GetHasLocalInClosure((FuncInfo *)sym), bVar2)) ||
         (((sym[6].name.string.ptr != (char16_t *)0x0 &&
           (bVar2 = Scope::GetMustInstantiate((Scope *)sym[6].name.string.ptr), bVar2)) ||
          (bVar2 = FuncInfo::IsBodyAndParamScopeMerged((FuncInfo *)sym), !bVar2)))) {
        bVar2 = FuncInfo::GetCallsEval((FuncInfo *)sym);
        if ((!bVar2) && (bVar2 = FuncInfo::GetHasLocalInClosure((FuncInfo *)sym), bVar2)) {
          ByteCodeGenerator::AssignFrameSlotsRegister((ByteCodeGenerator *)top);
        }
        bVar2 = FuncInfo::IsBodyAndParamScopeMerged((FuncInfo *)sym);
        if (!bVar2) {
          ByteCodeGenerator::AssignParamSlotsRegister((ByteCodeGenerator *)top);
        }
        bVar2 = ByteCodeGenerator::NeedObjectAsFunctionScope
                          ((ByteCodeGenerator *)top,(FuncInfo *)sym,
                           *(ParseNodeFnc **)&sym[6].name.len);
        if (((bVar2) || (bVar2 = Scope::GetIsObject(*(Scope **)&sym[5].assignmentState), bVar2)) ||
           (bVar2 = Scope::GetIsObject(*(Scope **)&sym[5].symbolType), bVar2)) {
          ByteCodeGenerator::AssignFrameObjRegister((ByteCodeGenerator *)top);
        }
        bVar2 = FuncInfo::GetCallsEval((FuncInfo *)sym);
        if (((bVar2) || (*(int *)&(byteCodeGenerator_local->m_writer).m_loopHeaders != 0)) ||
           ((bVar2 = FuncInfo::GetHasArguments((FuncInfo *)sym), bVar2 &&
            (((byteCodeGenerator_local->m_writer).m_labelOffsets !=
              (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)0x0 && (bVar2 = ByteCodeGenerator::IsInDebugMode((ByteCodeGenerator *)top), bVar2))
            )))) {
          ByteCodeGenerator::SetNeedEnvRegister((ByteCodeGenerator *)top);
          ByteCodeGenerator::AssignFrameDisplayRegister((ByteCodeGenerator *)top);
        }
      }
      bVar2 = FuncInfo::GetHasArguments((FuncInfo *)sym);
      if (bVar2) {
        pSVar11 = FuncInfo::GetArgumentsSymbol((FuncInfo *)sym);
        if (pSVar11 == (Symbol *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0xb46,"(argSym)","argSym");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        if (pSVar11 != (Symbol *)0x0) {
          uVar6 = Scope::GetScopeSlotCount(*(Scope **)&sym[5].assignmentState);
          if (uVar6 != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                               ,0xb49,"(top->bodyScope->GetScopeSlotCount() == 0)",
                               "top->bodyScope->GetScopeSlotCount() == 0");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 0;
          }
          if (*(int *)&sym[2].pid != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                               ,0xb4a,"(top->argsPlaceHolderSlotCount == 0)",
                               "top->argsPlaceHolderSlotCount == 0");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 0;
          }
          ByteCodeGenerator::AssignRegister((ByteCodeGenerator *)top,pSVar11);
          setArgScopeSlot.i._4_4_ = 0;
          setArgScopeSlot.top = (FuncInfo **)((long)&setArgScopeSlot.i + 4);
          bVar2 = ByteCodeGenerator::NeedScopeObjectForArguments
                            ((ByteCodeGenerator *)top,(FuncInfo *)sym,
                             (ParseNodeFnc *)byteCodeGenerator_local);
          if (bVar2) {
            fn_00.i = (uint *)setArgScopeSlot.top;
            fn_00.top = (FuncInfo **)&sym;
            MapFormals<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
                      ((ParseNodeFnc *)byteCodeGenerator_local,fn_00);
            bVar2 = Symbol::NeedsSlotAlloc(pSVar11,(ByteCodeGenerator *)top,(FuncInfo *)sym);
            if (bVar2) {
              PVar7 = Symbol::GetScopeSlot(pSVar11);
              if (PVar7 != -1) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar12 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                   ,0xb65,"(argSym->GetScopeSlot() == Js::Constants::NoProperty)",
                                   "argSym->GetScopeSlot() == Js::Constants::NoProperty");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar12 = 0;
              }
              uVar6 = setArgScopeSlot.i._4_4_;
              setArgScopeSlot.i._4_4_ = setArgScopeSlot.i._4_4_ + 1;
              Symbol::SetScopeSlot(pSVar11,uVar6);
            }
            fn.i = (uint *)setArgScopeSlot.top;
            fn.top = (FuncInfo **)&sym;
            MapFormalsFromPattern<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
                      ((ParseNodeFnc *)byteCodeGenerator_local,fn);
          }
          Scope::SetScopeSlotCount(*(Scope **)&sym[5].symbolType,setArgScopeSlot.i._4_4_);
          bVar2 = FuncInfo::GetHasHeapArguments((FuncInfo *)sym);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                               ,0xb6d,"(top->GetHasHeapArguments())","top->GetHasHeapArguments()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 0;
          }
          bVar2 = ByteCodeGenerator::NeedScopeObjectForArguments
                            ((ByteCodeGenerator *)top,(FuncInfo *)sym,
                             (ParseNodeFnc *)byteCodeGenerator_local);
          if ((bVar2) &&
             (bVar2 = ParseNodeFnc::HasNonSimpleParameterList
                                ((ParseNodeFnc *)byteCodeGenerator_local), !bVar2)) {
            Js::ParseableFunctionInfo::SetHasImplicitArgIns
                      ((ParseableFunctionInfo *)sym[6].pid,false);
          }
        }
      }
    }
    pSVar11 = FuncInfo::GetNewTargetSymbol((FuncInfo *)sym);
    pFVar9 = top;
    if (pSVar11 != (Symbol *)0x0) {
      pSVar11 = FuncInfo::GetNewTargetSymbol((FuncInfo *)sym);
      ByteCodeGenerator::AssignRegister((ByteCodeGenerator *)pFVar9,pSVar11);
    }
    pSVar11 = FuncInfo::GetThisSymbol((FuncInfo *)sym);
    pFVar9 = top;
    if (pSVar11 != (Symbol *)0x0) {
      pSVar11 = FuncInfo::GetThisSymbol((FuncInfo *)sym);
      ByteCodeGenerator::AssignRegister((ByteCodeGenerator *)pFVar9,pSVar11);
      bVar2 = FuncInfo::IsGlobalFunction((FuncInfo *)sym);
      if (bVar2) {
        ByteCodeGenerator::AssignNullConstRegister((ByteCodeGenerator *)top);
      }
    }
    pSVar11 = FuncInfo::GetSuperSymbol((FuncInfo *)sym);
    pFVar9 = top;
    if (pSVar11 != (Symbol *)0x0) {
      pSVar11 = FuncInfo::GetSuperSymbol((FuncInfo *)sym);
      ByteCodeGenerator::AssignRegister((ByteCodeGenerator *)pFVar9,pSVar11);
    }
    pSVar11 = FuncInfo::GetSuperConstructorSymbol((FuncInfo *)sym);
    pFVar9 = top;
    if (pSVar11 != (Symbol *)0x0) {
      pSVar11 = FuncInfo::GetSuperConstructorSymbol((FuncInfo *)sym);
      ByteCodeGenerator::AssignRegister((ByteCodeGenerator *)pFVar9,pSVar11);
    }
    pSVar11 = FuncInfo::GetImportMetaSymbol((FuncInfo *)sym);
    pFVar9 = top;
    if (pSVar11 != (Symbol *)0x0) {
      pSVar11 = FuncInfo::GetImportMetaSymbol((FuncInfo *)sym);
      ByteCodeGenerator::AssignRegister((ByteCodeGenerator *)pFVar9,pSVar11);
    }
    if ((local_fb != false) && (this_01 == (Symbol *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0xb9f,"(!funcExprWithName || sym)","!funcExprWithName || sym");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    if (local_fb != false) {
      if (sym[6].name.string.ptr == (char16_t *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0xba2,"(top->funcExprScope)","top->funcExprScope");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      bVar2 = FuncInfo::GetCallsEval((FuncInfo *)sym);
      if ((bVar2) || (bVar2 = FuncInfo::GetChildCallsEval((FuncInfo *)sym), bVar2)) {
        Scope::SetIsObject((Scope *)sym[6].name.string.ptr);
      }
      bVar2 = Scope::GetIsObject((Scope *)sym[6].name.string.ptr);
      if (bVar2) {
        pSVar14 = (Scope *)sym[6].name.string.ptr;
        RVar8 = ByteCodeGenerator::NextVarRegister((ByteCodeGenerator *)top);
        Scope::SetLocation(pSVar14,RVar8);
      }
    }
  }
  ByteCodeGenerator::EndBindFunction((ByteCodeGenerator *)top,local_fb);
  bVar2 = FuncInfo::IsGlobalFunction((FuncInfo *)sym);
  if (bVar2) {
    pnodeFnc_local = (ParseNodeFnc *)sym;
  }
  else {
    bVar2 = FuncInfo::IsBodyAndParamScopeMerged((FuncInfo *)sym);
    if (bVar2) {
      Scope::MergeParamAndBodyScopes((ParseNodeFnc *)byteCodeGenerator_local);
      Scope::RemoveParamScope((ParseNodeFnc *)byteCodeGenerator_local);
    }
    else {
      bVar2 = Scope::GetIsObject(*(Scope **)&sym[5].assignmentState);
      bVar3 = Scope::GetIsObject(*(Scope **)&sym[5].symbolType);
      if (bVar2 != bVar3) {
        bVar2 = Scope::GetIsObject(*(Scope **)&sym[5].assignmentState);
        bVar3 = Scope::GetIsObject(*(Scope **)&sym[5].symbolType);
        if (bVar2 != bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0xbc0,
                             "(top->bodyScope->GetIsObject() == top->paramScope->GetIsObject())",
                             "top->bodyScope->GetIsObject() == top->paramScope->GetIsObject()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        Js::Throw::FatalInternalError(-0x7fffbffb);
      }
    }
    pFVar9 = ByteCodeGenerator::TopFuncInfo((ByteCodeGenerator *)top);
    pFVar13 = Js::FunctionProxy::GetFunctionBody(&pFVar9->byteCodeFunction->super_FunctionProxy);
    if (pFVar13 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0xbc6,"(parentFunctionBody != nullptr)","parentFunctionBody != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    globalEvalBlockScope._7_1_ = Js::FunctionBody::HasAllNonLocalReferenced(pFVar13);
    bVar2 = ParseNodeFnc::HasHomeObj((ParseNodeFnc *)byteCodeGenerator_local);
    if ((bVar2) &&
       (RVar8 = ParseNodeFnc::GetHomeObjLocation((ParseNodeFnc *)byteCodeGenerator_local),
       this_00 = byteCodeGenerator_local, RVar8 == 0xffffffff)) {
      RVar8 = FuncInfo::AssignUndefinedConstRegister(pFVar9);
      ParseNodeFnc::SetHomeObjLocation((ParseNodeFnc *)this_00,RVar8);
    }
    bVar2 = FuncInfo::IsGlobalFunction(pFVar9);
    if (bVar2) {
      bVar2 = ByteCodeGenerator::IsEvalWithNoParentScopeInfo((ByteCodeGenerator *)top);
      if (bVar2) {
        pSVar14 = FuncInfo::GetGlobalEvalBlockScope(pFVar9);
        bVar2 = Scope::GetHasOwnLocalInClosure(pSVar14);
        if (bVar2) {
          Scope::SetMustInstantiate(pSVar14,true);
        }
      }
    }
    else {
      if ((globalEvalBlockScope._7_1_) && (bVar2 = Js::FunctionBody::HasSetIsObject(pFVar13), bVar2)
         ) {
        pSVar14 = FuncInfo::GetBodyScope(pFVar9);
        Scope::SetIsObject(pSVar14);
        pSVar14 = FuncInfo::GetParamScope(pFVar9);
        Scope::SetIsObject(pSVar14);
      }
      bVar2 = ByteCodeGenerator::CanStackNestedFunc((ByteCodeGenerator *)top,(FuncInfo *)sym,false);
      if ((!bVar2) ||
         (bVar2 = ByteCodeGenerator::NeedObjectAsFunctionScope
                            ((ByteCodeGenerator *)top,(FuncInfo *)sym,
                             (ParseNodeFnc *)byteCodeGenerator_local), bVar2)) {
        FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar9,L"Child");
      }
    }
    bVar2 = FuncInfo::GetCallsEval((FuncInfo *)sym);
    if ((bVar2) || (bVar2 = FuncInfo::GetChildCallsEval((FuncInfo *)sym), bVar2)) {
      FuncInfo::SetChildCallsEval(pFVar9,true);
      this_02 = ByteCodeGenerator::GetCurrentBlock((ByteCodeGenerator *)top);
      if (this_02 != (ParseNodeBlock *)0x0) {
        if ((this_02->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0xbf5,"(currentBlock->nop == knopBlock)",
                             "currentBlock->nop == knopBlock");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        ParseNodeBlock::SetChildCallsEval(this_02,true);
      }
      FuncInfo::SetHasHeapArguments(pFVar9,true,false);
      globalEvalBlockScope._7_1_ = true;
      Js::FunctionBody::SetAllNonLocalReferenced(pFVar13,true);
      pSVar14 = (Scope *)sym[6].name.string.ptr;
      if (pSVar14 != (Scope *)0x0) {
        Scope::SetIsObject(pSVar14);
      }
      if (pFVar9->inArgsCount == 1) {
        ByteCodeGenerator::AssignNullConstRegister((ByteCodeGenerator *)top);
      }
    }
    if ((globalEvalBlockScope._7_1_ != false) &&
       (bVar2 = Js::FunctionBody::HasDoneAllNonLocalReferenced(pFVar13), !bVar2)) {
      pSVar14 = FuncInfo::GetBodyScope(pFVar9);
      Scope::ForceAllSymbolNonLocalReference(pSVar14,(ByteCodeGenerator *)top);
      bVar2 = FuncInfo::IsGlobalFunction(pFVar9);
      if (!bVar2) {
        pSVar14 = FuncInfo::GetParamScope(pFVar9);
        Scope::ForceAllSymbolNonLocalReference(pSVar14,(ByteCodeGenerator *)top);
      }
      Js::FunctionBody::SetHasDoneAllNonLocalReferenced(pFVar13,true);
    }
    bVar2 = ParseNodeFnc::IsGenerator((ParseNodeFnc *)byteCodeGenerator_local);
    if (bVar2) {
      FuncInfo::AssignUndefinedConstRegister((FuncInfo *)sym);
    }
    bVar2 = ParseNodeFnc::IsConstructor(*(ParseNodeFnc **)&sym[6].name.len);
    if ((((bVar2) &&
         ((bVar2 = FuncInfo::GetCallsEval((FuncInfo *)sym), bVar2 ||
          (bVar2 = FuncInfo::GetChildCallsEval((FuncInfo *)sym), bVar2)))) ||
        (BVar4 = FuncInfo::IsClassConstructor((FuncInfo *)sym), BVar4 != 0)) &&
       (BVar4 = FuncInfo::IsBaseClassConstructor((FuncInfo *)sym), BVar4 == 0)) {
      FuncInfo::AssignUndefinedConstRegister((FuncInfo *)sym);
    }
    AssignFuncSymRegister
              ((ParseNodeFnc *)byteCodeGenerator_local,(ByteCodeGenerator *)top,(FuncInfo *)sym);
    if (((((byteCodeGenerator_local->m_writer).m_longJumpOffsets !=
           (List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)0x0) &&
         (bVar2 = ParseNodeFnc::HasReferenceableBuiltInArguments
                            ((ParseNodeFnc *)byteCodeGenerator_local), bVar2)) &&
        (bVar2 = ParseNodeFnc::UsesArguments((ParseNodeFnc *)byteCodeGenerator_local), bVar2)) &&
       (bVar2 = ParseNodeFnc::HasHeapArguments((ParseNodeFnc *)byteCodeGenerator_local), bVar2)) {
      bVar2 = Js::ParseableFunctionInfo::GetDoBackendArgumentsOptimization
                        ((ParseableFunctionInfo *)sym[6].pid);
      bVar3 = FuncInfo::GetHasLocalInClosure((FuncInfo *)sym);
      local_151 = false;
      if (bVar3) {
        pSVar14 = FuncInfo::GetParamScope((FuncInfo *)sym);
        local_151 = Scope::GetHasOwnLocalInClosure(pSVar14);
      }
      if ((bVar2) && (1 < *(ushort *)&sym[1].name.string.ptr)) {
        if ((bVar2) && (local_151 != false)) {
          FuncInfo::SetHasHeapArguments((FuncInfo *)sym,true,false);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,PerfHintPhase);
          if (bVar2) {
            pFVar13 = FuncInfo::GetParsedFunctionBody((FuncInfo *)sym);
            WritePerfHint(HeapArgumentsDueToNonLocalRef,pFVar13,0);
          }
        }
        else {
          bVar2 = FuncInfo::GetHasLocalInClosure((FuncInfo *)sym);
          if (((!bVar2) &&
              (uVar5 = ByteCodeGenerator::GetFlags((ByteCodeGenerator *)top), (uVar5 & 0x400) == 0))
             && (bVar2 = Js::ParseableFunctionInfo::IsEval((ParseableFunctionInfo *)sym[6].pid),
                !bVar2)) {
            Js::ParseableFunctionInfo::SetDoScopeObjectCreation
                      ((ParseableFunctionInfo *)sym[6].pid,false);
          }
        }
      }
    }
    pnodeFnc_local = (ParseNodeFnc *)sym;
  }
  return (FuncInfo *)pnodeFnc_local;
}

Assistant:

FuncInfo* PostVisitFunction(ParseNodeFnc* pnodeFnc, ByteCodeGenerator* byteCodeGenerator)
{
    // Assign function-wide registers such as local frame object, closure environment, etc., based on
    // observed attributes. Propagate attributes to the parent function (if any).
    FuncInfo *top = byteCodeGenerator->TopFuncInfo();
    Symbol *sym = pnodeFnc->GetFuncSymbol();
    bool funcExprWithName = !top->IsGlobalFunction() && sym && sym->GetIsFuncExpr();

    if (top->IsLambda())
    {
        FuncInfo *enclosingNonLambda = byteCodeGenerator->FindEnclosingNonLambda();

        if (enclosingNonLambda->IsGlobalFunction())
        {
            top->byteCodeFunction->SetEnclosedByGlobalFunc();
        }

        if (FuncAllowsDirectSuper(enclosingNonLambda, byteCodeGenerator))
        {
            top->byteCodeFunction->GetFunctionInfo()->SetAllowDirectSuper();
        }
    }
    else if (FuncAllowsDirectSuper(top, byteCodeGenerator))
    {
        top->byteCodeFunction->GetFunctionInfo()->SetAllowDirectSuper();
    }

    // If this is a named function expression and has deferred child, mark has non-local reference.
    if (funcExprWithName)
    {
        // If we are reparsing this function due to being in debug mode - we should restore the state of this from the earlier parse
        if (top->byteCodeFunction->IsFunctionParsed() && top->GetParsedFunctionBody()->HasFuncExprNameReference())
        {
            top->SetFuncExprNameReference(true);
        }
        if (sym->GetHasNonLocalReference())
        {
            // Before doing this, though, make sure there's no local symbol that hides the function name
            // from the nested functions. If a lookup starting at the current local scope finds some symbol
            // other than the func expr, then it's hidden. (See Win8 393618.)
            byteCodeGenerator->ProcessCapturedSym(sym);

            top->SetFuncExprNameReference(true);
            if (pnodeFnc->pnodeBody)
            {
                top->GetParsedFunctionBody()->SetFuncExprNameReference(true);
            }
            byteCodeGenerator->ProcessScopeWithCapturedSym(sym->GetScope());
        }
    }

    if (pnodeFnc->nop != knopProg
        && !top->bodyScope->GetIsObject()
        && byteCodeGenerator->NeedObjectAsFunctionScope(top, pnodeFnc))
    {
        // Even if it wasn't determined during visiting this function that we need a scope object, we still have a few conditions that may require one.
        top->bodyScope->SetIsObject();
        if (!top->IsBodyAndParamScopeMerged())
        {
            // If we have the function inside an eval then access to outer variables should go through scope object.
            // So we set the body scope as object and we need to set the param scope also as object in case of split scope.
            top->paramScope->SetIsObject();
        }
    }

    if (pnodeFnc->nop == knopProg
        && top->byteCodeFunction->GetIsStrictMode()
        && (byteCodeGenerator->GetFlags() & fscrEval))
    {
        // At global scope inside a strict mode eval, vars will not leak out and require a scope object (along with its parent.)
        top->bodyScope->SetIsObject();
    }

    if (pnodeFnc->pnodeBody)
    {
        if (!top->IsGlobalFunction())
        {
            auto fnProcess =
                [byteCodeGenerator, top](Symbol *const sym)
                {
                    if (sym->GetHasNonLocalReference() && !sym->GetIsModuleExportStorage())
                    {
                        byteCodeGenerator->ProcessCapturedSym(sym);
                    }
                };

            Scope *bodyScope = top->bodyScope;
            Scope *paramScope = top->paramScope;
            if (paramScope != nullptr)
            {
                if (paramScope->GetHasOwnLocalInClosure())
                {
                    paramScope->ForEachSymbol(fnProcess);
                    top->SetHasLocalInClosure(true);
                }
            }

            if (bodyScope->GetHasOwnLocalInClosure())
            {
                bodyScope->ForEachSymbol(fnProcess);
                top->SetHasLocalInClosure(true);
            }

            PostVisitBlock(pnodeFnc->pnodeBodyScope, byteCodeGenerator);
            PostVisitBlock(pnodeFnc->pnodeScopes, byteCodeGenerator);
        }

        // This function refers to the closure environment if:
        // 1. it has a child function (we'll pass the environment to the constructor when the child is created -
        //      even if it's not needed, it's as cheap as loading "null" from the library);
        // 2. it calls eval (and will use the environment to construct the scope chain to pass to eval);
        // 3. it refers to a local defined in a parent function;
        // 4. some parent calls eval;
        // 5. we're in an event handler;
        // 6. the function was declared inside a "with";
        // 7. we're in an eval expression.
        if (pnodeFnc->nestedCount != 0 ||
            top->GetCallsEval() ||
            top->GetHasClosureReference() ||
            byteCodeGenerator->InDynamicScope() ||
            (byteCodeGenerator->GetFlags() & (fscrImplicitThis | fscrEval)))
        {
            byteCodeGenerator->SetNeedEnvRegister();
        }

        // This function needs to construct a local frame on the heap if it is not the global function (even in eval) and:
        // 1. it calls eval, which may refer to or declare any locals in this frame;
        // 2. a child calls eval (which may refer to locals through a closure);
        // 3. it uses non-strict mode "arguments", so the arguments have to be put in a closure;
        // 4. it defines a local that is used by a child function (read from a closure).
        // 5. it is a main function that's wrapped in a function expression scope but has locals used through
        //    a closure (used in forReference function call cases in a with for example).
        if (!top->IsGlobalFunction())
        {
            if (top->GetCallsEval() ||
                top->GetChildCallsEval() ||
                (top->GetHasArguments() && byteCodeGenerator->NeedScopeObjectForArguments(top, pnodeFnc)) ||
                top->GetHasLocalInClosure() ||
                (top->funcExprScope && top->funcExprScope->GetMustInstantiate()) ||
                // When we have split scope normally either eval will be present or the GetHasLocalInClosure will be true as one of the formal is
                // captured. But when we force split scope or split scope happens due to some other reasons we have to make sure we allocate frame
                // slot register here.
                (!top->IsBodyAndParamScopeMerged()))
            {
                if (!top->GetCallsEval() && top->GetHasLocalInClosure())
                {
                    byteCodeGenerator->AssignFrameSlotsRegister();
                }

                if (!top->IsBodyAndParamScopeMerged())
                {
                    byteCodeGenerator->AssignParamSlotsRegister();
                }

                if (byteCodeGenerator->NeedObjectAsFunctionScope(top, top->root)
                    || top->bodyScope->GetIsObject()
                    || top->paramScope->GetIsObject())
                {
                    byteCodeGenerator->AssignFrameObjRegister();
                }

                // The function also needs to construct a frame display if:
                // 1. it calls eval;
                // 2. it has a child function.
                // 3. When has arguments and in debug mode. So that frame display be there along with frame object register.
                if (top->GetCallsEval() ||
                    pnodeFnc->nestedCount != 0
                    || (top->GetHasArguments()
                        && (pnodeFnc->pnodeParams != nullptr)
                        && byteCodeGenerator->IsInDebugMode()))
                {
                    byteCodeGenerator->SetNeedEnvRegister(); // This to ensure that Env should be there when the FrameDisplay register is there.
                    byteCodeGenerator->AssignFrameDisplayRegister();
                }
            }

            if (top->GetHasArguments())
            {
                Symbol *argSym = top->GetArgumentsSymbol();
                Assert(argSym);
                if (argSym)
                {
                    Assert(top->bodyScope->GetScopeSlotCount() == 0);
                    Assert(top->argsPlaceHolderSlotCount == 0);
                    byteCodeGenerator->AssignRegister(argSym);
                    uint i = 0;
                    auto setArgScopeSlot = [&](ParseNode *pnodeArg)
                    {
                        if (pnodeArg->IsVarLetOrConst())
                        {
                            Symbol* sym = pnodeArg->AsParseNodeVar()->sym;
                            if (sym->GetScopeSlot() != Js::Constants::NoProperty)
                            {
                                top->argsPlaceHolderSlotCount++; // Same name args appeared before
                            }
                            sym->SetScopeSlot(i);
                        }
                        else if (pnodeArg->nop == knopParamPattern)
                        {
                            top->argsPlaceHolderSlotCount++;
                        }
                        i++;
                    };

                    // We need to include the rest as well -as it will get slot assigned.
                    if (byteCodeGenerator->NeedScopeObjectForArguments(top, pnodeFnc))
                    {
                        MapFormals(pnodeFnc, setArgScopeSlot);
                        if (argSym->NeedsSlotAlloc(byteCodeGenerator, top))
                        {
                            Assert(argSym->GetScopeSlot() == Js::Constants::NoProperty);
                            argSym->SetScopeSlot(i++);
                        }
                        MapFormalsFromPattern(pnodeFnc, setArgScopeSlot);
                    }

                    top->paramScope->SetScopeSlotCount(i);

                    Assert(top->GetHasHeapArguments());
                    if (byteCodeGenerator->NeedScopeObjectForArguments(top, pnodeFnc)
                        && !pnodeFnc->HasNonSimpleParameterList())
                    {
                        top->byteCodeFunction->SetHasImplicitArgIns(false);
                    }
                }
            }
        }
        else
        {
            Assert(top->IsGlobalFunction() || pnodeFnc->IsModule());
            // eval is called in strict mode
            bool newScopeForEval = (top->byteCodeFunction->GetIsStrictMode() && (byteCodeGenerator->GetFlags() & fscrEval));

            if (newScopeForEval)
            {
                byteCodeGenerator->SetNeedEnvRegister();
                byteCodeGenerator->AssignFrameObjRegister();
                byteCodeGenerator->AssignFrameDisplayRegister();
            }
        }

        if (top->GetNewTargetSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetNewTargetSymbol());
        }
        if (top->GetThisSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetThisSymbol());

            // Indirect eval has a 'this' binding and needs to load from null
            if (top->IsGlobalFunction())
            {
                byteCodeGenerator->AssignNullConstRegister();
            }
        }
        if (top->GetSuperSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetSuperSymbol());
        }
        if (top->GetSuperConstructorSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetSuperConstructorSymbol());
        }
        if (top->GetImportMetaSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetImportMetaSymbol());
        }

        Assert(!funcExprWithName || sym);
        if (funcExprWithName)
        {
            Assert(top->funcExprScope);
            // If the func expr may be accessed via eval, force the func expr scope into an object.
            if (top->GetCallsEval() || top->GetChildCallsEval())
            {
                top->funcExprScope->SetIsObject();
            }
            if (top->funcExprScope->GetIsObject())
            {
                top->funcExprScope->SetLocation(byteCodeGenerator->NextVarRegister());
            }
        }
    }

    byteCodeGenerator->EndBindFunction(funcExprWithName);

    // If the "child" is the global function, we're done.
    if (top->IsGlobalFunction())
    {
        return top;
    }

    if (top->IsBodyAndParamScopeMerged())
    {
        Scope::MergeParamAndBodyScopes(pnodeFnc);
        Scope::RemoveParamScope(pnodeFnc);
    }
    else
    {
        // A param and body scope exist for the same function, they
        // should both either be using scope slots or scope objects.
        Assert_FailFast(top->bodyScope->GetIsObject() == top->paramScope->GetIsObject());
    }

    FuncInfo* const parentFunc = byteCodeGenerator->TopFuncInfo();

    Js::FunctionBody * parentFunctionBody = parentFunc->byteCodeFunction->GetFunctionBody();
    Assert(parentFunctionBody != nullptr);
    bool setHasNonLocalReference = parentFunctionBody->HasAllNonLocalReferenced();

    // This is required for class constructors as will be able to determine the actual home object register only after emitting InitClass
    if (pnodeFnc->HasHomeObj() && pnodeFnc->GetHomeObjLocation() == Js::Constants::NoRegister)
    {
        pnodeFnc->SetHomeObjLocation(parentFunc->AssignUndefinedConstRegister());
    }

    // If we have any deferred child, we need to instantiate the fake global block scope if it is not empty
    if (parentFunc->IsGlobalFunction())
    {
        if (byteCodeGenerator->IsEvalWithNoParentScopeInfo())
        {
            Scope * globalEvalBlockScope = parentFunc->GetGlobalEvalBlockScope();
            if (globalEvalBlockScope->GetHasOwnLocalInClosure())
            {
                globalEvalBlockScope->SetMustInstantiate(true);
            }
        }
    }
    else
    {
        if (setHasNonLocalReference)
        {
            // All locals are already marked as non-locals-referenced. Mark the parent as well.
            if (parentFunctionBody->HasSetIsObject())
            {
                // Updated the current function, as per the previous stored info.
                parentFunc->GetBodyScope()->SetIsObject();
                parentFunc->GetParamScope()->SetIsObject();
            }
        }
        // Propagate HasMaybeEscapedNestedFunc
        if (!byteCodeGenerator->CanStackNestedFunc(top, false) ||
            byteCodeGenerator->NeedObjectAsFunctionScope(top, pnodeFnc))
        {
            parentFunc->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("Child")));
        }
    }

    if (top->GetCallsEval() || top->GetChildCallsEval())
    {
        parentFunc->SetChildCallsEval(true);
        ParseNodeBlock *currentBlock = byteCodeGenerator->GetCurrentBlock();
        if (currentBlock)
        {
            Assert(currentBlock->nop == knopBlock);
            currentBlock->SetChildCallsEval(true);
        }
        parentFunc->SetHasHeapArguments(true);
        setHasNonLocalReference = true;
        parentFunctionBody->SetAllNonLocalReferenced(true);

        Scope * const funcExprScope = top->funcExprScope;
        if (funcExprScope)
        {
            // If we have the body scope as an object, the outer function expression scope also needs to be an object to propagate the name.
            funcExprScope->SetIsObject();
        }

        if (parentFunc->inArgsCount == 1)
        {
            // If no formals to function, no need to create the propertyid array
            byteCodeGenerator->AssignNullConstRegister();
        }
    }

    if (setHasNonLocalReference && !parentFunctionBody->HasDoneAllNonLocalReferenced())
    {
        parentFunc->GetBodyScope()->ForceAllSymbolNonLocalReference(byteCodeGenerator);
        if (!parentFunc->IsGlobalFunction())
        {
            parentFunc->GetParamScope()->ForceAllSymbolNonLocalReference(byteCodeGenerator);
        }
        parentFunctionBody->SetHasDoneAllNonLocalReferenced(true);
    }

    if (pnodeFnc->IsGenerator())
    {
        top->AssignUndefinedConstRegister();
    }

    if ((top->root->IsConstructor() && (top->GetCallsEval() || top->GetChildCallsEval())) || top->IsClassConstructor())
    {
        if (!top->IsBaseClassConstructor())
        {
            // Derived class constructors need to check undefined against explicit return statements.
            top->AssignUndefinedConstRegister();
        }
    }

    AssignFuncSymRegister(pnodeFnc, byteCodeGenerator, top);

    if (pnodeFnc->pnodeBody && pnodeFnc->HasReferenceableBuiltInArguments() && pnodeFnc->UsesArguments() &&
        pnodeFnc->HasHeapArguments())
    {
        bool doStackArgsOpt = top->byteCodeFunction->GetDoBackendArgumentsOptimization();

        bool hasAnyParamInClosure = top->GetHasLocalInClosure() && top->GetParamScope()->GetHasOwnLocalInClosure();

        if ((doStackArgsOpt && top->inArgsCount > 1))
        {
            if (doStackArgsOpt && hasAnyParamInClosure)
            {
                top->SetHasHeapArguments(true, false /*= Optimize arguments in backend*/);
#ifdef PERF_HINT
                if (PHASE_TRACE1(Js::PerfHintPhase))
                {
                    WritePerfHint(PerfHints::HeapArgumentsDueToNonLocalRef, top->GetParsedFunctionBody(), 0);
                }
#endif
            }
            else if (!top->GetHasLocalInClosure() && !(byteCodeGenerator->GetFlags() & fscrEval) && !top->byteCodeFunction->IsEval())
            {
                //Scope object creation instr will be a MOV NULL instruction in the Lowerer - if we still decide to do StackArgs after Globopt phase.
                //Note that if we're in eval, scoped ldfld/stfld will traverse the whole frame display, including this slot, so it can't be null.
                top->byteCodeFunction->SetDoScopeObjectCreation(false);
            }
        }
    }
    return top;
}